

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

common_chat_templates_ptr
common_chat_templates_init
          (llama_model *model,string *chat_template_override,string *bos_token_override,
          string *eos_token_override)

{
  pointer pcVar1;
  chat_template *pcVar2;
  size_type sVar3;
  int iVar4;
  llama_token lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  chat_template *pcVar8;
  default_delete<minja::chat_template> *this;
  long *in_R8;
  pointer __p;
  string default_template_src;
  string template_tool_use_src;
  string token_eos;
  string token_bos;
  llama_vocab *vocab;
  anon_class_24_3_9d428893 get_token;
  bool local_f9;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  undefined8 local_50;
  string *local_48;
  string *local_40;
  undefined8 *local_38;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  if (bos_token_override->_M_string_length == 0) {
    if (chat_template_override == (string *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
                 ,0x17b,"GGML_ASSERT(%s) failed","model != nullptr");
    }
    pcVar6 = (char *)llama_model_chat_template(chat_template_override);
    sVar3 = local_d0._M_string_length;
    local_f9 = pcVar6 != (char *)0x0;
    if (local_f9) {
      strlen(pcVar6);
      std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)sVar3,(ulong)pcVar6);
    }
    pcVar6 = (char *)llama_model_chat_template(chat_template_override);
    sVar3 = local_b0._M_string_length;
    if (pcVar6 != (char *)0x0) {
      strlen(pcVar6);
      local_f9 = true;
      std::__cxx11::string::_M_replace((ulong)&local_b0,0,(char *)sVar3,(ulong)pcVar6);
    }
  }
  else {
    local_f9 = true;
    std::__cxx11::string::_M_assign((string *)&local_d0);
  }
  if (((char *)local_d0._M_string_length == (char *)0x0) ||
     (iVar4 = std::__cxx11::string::compare((char *)&local_d0), iVar4 == 0)) {
    if ((char *)local_b0._M_string_length == (char *)0x0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_d0,0,(char *)local_d0._M_string_length,0x22825d);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_d0);
    }
  }
  pcVar1 = (eos_token_override->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + eos_token_override->_M_string_length);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,*in_R8,in_R8[1] + *in_R8);
  if (chat_template_override != (string *)0x0) {
    local_50 = llama_model_get_vocab(chat_template_override);
    local_38 = &local_50;
    local_48 = &local_d0;
    local_40 = &local_b0;
    lVar5 = llama_vocab_bos(local_50);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_(&local_f0,&local_48,lVar5,"BOS","bos_token");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    lVar5 = llama_vocab_eos(local_50);
    common_chat_templates_init(llama_model_const*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)
    ::$_0::operator()[abi_cxx11_(&local_f0,&local_48,lVar5,"EOS","eos_token");
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  puVar7 = (undefined8 *)operator_new(0x18);
  *puVar7 = 0;
  puVar7[1] = 0;
  puVar7[2] = 0;
  *(undefined8 **)model = puVar7;
  *(bool *)puVar7 = local_f9;
  pcVar8 = (chat_template *)operator_new(0xa0);
  minja::chat_template::chat_template(pcVar8,&local_d0,&local_70,&local_90);
  this = (default_delete<minja::chat_template> *)(puVar7 + 1);
  local_f0._M_dataplus._M_p = (pointer)0x0;
  pcVar2 = *(chat_template **)this;
  *(chat_template **)this = pcVar8;
  if ((pcVar2 != (chat_template *)0x0) &&
     (std::default_delete<minja::chat_template>::operator()(this,pcVar2),
     (chat_template *)local_f0._M_dataplus._M_p != (chat_template *)0x0)) {
    std::default_delete<minja::chat_template>::operator()
              ((default_delete<minja::chat_template> *)&local_f0,
               (chat_template *)local_f0._M_dataplus._M_p);
  }
  if ((char *)local_b0._M_string_length != (char *)0x0) {
    pcVar8 = (chat_template *)operator_new(0xa0);
    minja::chat_template::chat_template(pcVar8,&local_b0,&local_70,&local_90);
    local_f0._M_dataplus._M_p = (pointer)0x0;
    pcVar2 = (chat_template *)puVar7[2];
    puVar7[2] = pcVar8;
    if ((pcVar2 != (chat_template *)0x0) &&
       (std::default_delete<minja::chat_template>::operator()
                  ((default_delete<minja::chat_template> *)(puVar7 + 2),pcVar2),
       (chat_template *)local_f0._M_dataplus._M_p != (chat_template *)0x0)) {
      std::default_delete<minja::chat_template>::operator()
                ((default_delete<minja::chat_template> *)&local_f0,
                 (chat_template *)local_f0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return (__uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true>)
         (__uniq_ptr_data<common_chat_templates,_common_chat_templates_deleter,_true,_true>)model;
}

Assistant:

common_chat_templates_ptr common_chat_templates_init(
    const struct llama_model * model,
    const std::string & chat_template_override,
    const std::string & bos_token_override,
    const std::string & eos_token_override)
{
    std::string default_template_src;
    std::string template_tool_use_src;

    bool has_explicit_template = !chat_template_override.empty();
    if (chat_template_override.empty()) {
        GGML_ASSERT(model != nullptr);
        const auto * str = llama_model_chat_template(model, /* name */ nullptr);
        if (str) {
            default_template_src = str;
            has_explicit_template = true;
        }
        str = llama_model_chat_template(model, /* name */ "tool_use");
        if (str) {
            template_tool_use_src = str;
            has_explicit_template = true;
        }
    } else {
        default_template_src = chat_template_override;
    }
    if (default_template_src.empty() || default_template_src == "chatml") {
        if (!template_tool_use_src.empty()) {
            default_template_src = template_tool_use_src;
        } else {
            default_template_src = CHATML_TEMPLATE_SRC;
        }
    }
    std::string token_bos = bos_token_override;
    std::string token_eos = eos_token_override;
    if (model) {
        const auto * vocab = llama_model_get_vocab(model);
        const auto get_token = [&](llama_token token, const char * name, const char * jinja_variable_name) {
            if (token == LLAMA_TOKEN_NULL) {
                if (default_template_src.find(jinja_variable_name) != std::string::npos
                    || template_tool_use_src.find(jinja_variable_name) != std::string::npos) {
                    LOG_WRN("common_chat_templates_init: warning: vocab does not have a %s token, jinja template won't work as intended.\n", name);
                }
                return std::string();
            }
            return common_token_to_piece(vocab, token, true);
        };
        token_bos = get_token(llama_vocab_bos(vocab), "BOS", "bos_token");
        token_eos = get_token(llama_vocab_eos(vocab), "EOS", "eos_token");
    }
    common_chat_templates_ptr tmpls(new common_chat_templates());
    tmpls->has_explicit_template = has_explicit_template;
    try {
        tmpls->template_default = std::make_unique<minja::chat_template>(default_template_src, token_bos, token_eos);
    } catch (const std::exception & e) {
        LOG_ERR("%s: failed to parse chat template (defaulting to chatml): %s \n", __func__, e.what());
        tmpls->template_default = std::make_unique<minja::chat_template>(CHATML_TEMPLATE_SRC, token_bos, token_eos);
    }
    if (!template_tool_use_src.empty()) {
        try {
            tmpls->template_tool_use = std::make_unique<minja::chat_template>(template_tool_use_src, token_bos, token_eos);
        } catch (const std::exception & e) {
            LOG_ERR("%s: failed to parse tool use chat template (ignoring it): %s\n", __func__, e.what());
        }
    }
    return tmpls;
}